

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBar::wheelEvent(QScrollBar *this,QWheelEvent *event)

{
  QScrollBarPrivate *this_00;
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  Orientation OVar4;
  uint uVar5;
  int delta;
  uint uVar6;
  uint uVar7;
  
  event[0xc] = (QWheelEvent)0x0;
  uVar3 = (uint)*(undefined8 *)(event + 0x58);
  uVar6 = -uVar3;
  if (0 < (int)uVar3) {
    uVar6 = uVar3;
  }
  uVar5 = (uint)((ulong)*(undefined8 *)(event + 0x58) >> 0x20);
  uVar7 = -uVar5;
  if (0 < (int)uVar5) {
    uVar7 = uVar5;
  }
  if ((uVar3 != 0 && uVar6 <= uVar7) &&
     (OVar4 = QAbstractSlider::orientation(&this->super_QAbstractSlider), OVar4 == Horizontal)) {
    return;
  }
  delta = (int)((ulong)*(undefined8 *)(event + 0x58) >> 0x20);
  if (uVar7 < uVar6) {
    delta = -(int)*(undefined8 *)(event + 0x58);
  }
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  bVar1 = QAbstractSliderPrivate::scrollByDelta
                    (&this_00->super_QAbstractSliderPrivate,(uVar6 <= uVar7) + Horizontal,
                     (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                     *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20),delta);
  if (bVar1) {
    event[0xc] = (QWheelEvent)0x1;
  }
  uVar2 = *(ushort *)(event + 0x4e) >> 0xc & 7;
  if (uVar2 == 1) {
    bVar1 = false;
  }
  else {
    if (uVar2 != 3) {
      return;
    }
    bVar1 = true;
  }
  QScrollBarPrivate::setTransient(this_00,bVar1);
  return;
}

Assistant:

void QScrollBar::wheelEvent(QWheelEvent *event)
{
    event->ignore();
    bool horizontal = qAbs(event->angleDelta().x()) > qAbs(event->angleDelta().y());
    // The vertical wheel can be used to scroll a horizontal scrollbar, but only if
    // there is no simultaneous horizontal wheel movement.  This is to avoid chaotic
    // scrolling on touchpads.
    if (!horizontal && event->angleDelta().x() != 0 && orientation() == Qt::Horizontal)
        return;
    // scrollbar is a special case - in vertical mode it reaches minimum
    // value in the upper position, however QSlider's minimum value is on
    // the bottom. So we need to invert the value, but since the scrollbar is
    // inverted by default, we need to invert the delta value only for the
    // horizontal orientation.
    int delta = horizontal ? -event->angleDelta().x() : event->angleDelta().y();
    Q_D(QScrollBar);
    if (d->scrollByDelta(horizontal ? Qt::Horizontal : Qt::Vertical, event->modifiers(), delta))
        event->accept();

    if (event->phase() == Qt::ScrollBegin)
        d->setTransient(false);
    else if (event->phase() == Qt::ScrollEnd)
        d->setTransient(true);
}